

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_text.cpp
# Opt level: O0

void set_initial_text_values(Am_Object *inter,Am_Object *cmd,Am_Object *obj,int x,int y)

{
  bool bVar1;
  Am_Value *in_value;
  ostream *poVar2;
  Am_Object local_50 [3];
  undefined1 local_38 [8];
  Am_Value value;
  int y_local;
  int x_local;
  Am_Object *obj_local;
  Am_Object *cmd_local;
  Am_Object *inter_local;
  
  value.value.float_value = (float)y;
  value.value.long_value._4_4_ = x;
  Am_Value::Am_Value((Am_Value *)local_38);
  bVar1 = Am_Object::operator!=(obj,inter);
  if (bVar1) {
    in_value = Am_Object::Peek(obj,0xab,0);
    Am_Value::operator=((Am_Value *)local_38,in_value);
    bVar1 = Am_Value::Valid((Am_Value *)local_38);
    if ((!bVar1) || (local_38._0_2_ != 0x8008)) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar2 = std::operator<<(poVar2,"For text interactor ");
      poVar2 = operator<<(poVar2,inter);
      poVar2 = std::operator<<(poVar2," the Am_TEXT slot of its object ");
      poVar2 = operator<<(poVar2,obj);
      poVar2 = std::operator<<(poVar2," must contain a value of type string, but it contains ");
      poVar2 = operator<<(poVar2,(Am_Value *)local_38);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      Am_Error();
    }
    Am_Object::Am_Object(local_50,obj);
    move_text_cursor(local_50,value.value.long_value._4_4_,(int)value.value.float_value);
    Am_Object::~Am_Object(local_50);
  }
  Am_Object::Set(inter,0x16c,(Am_Value *)local_38,1);
  Am_Object::Set(cmd,0x16c,(Am_Value *)local_38,0);
  Am_Value::~Am_Value((Am_Value *)local_38);
  return;
}

Assistant:

void
set_initial_text_values(Am_Object &inter, Am_Object &cmd, Am_Object &obj, int x,
                        int y)
{
  Am_Value value;
  if (obj != inter) { //then is a text create command
    value = obj.Peek(Am_TEXT);
    if (!value.Valid() || value.type != Am_STRING) {
      Am_ERRORO("For text interactor "
                    << inter << " the Am_TEXT slot of its object " << obj
                    << " must contain a value of type string, but it contains "
                    << value,
                obj, Am_TEXT);
    }
    move_text_cursor(obj, x, y);
  }
  inter.Set(Am_OLD_VALUE, value, Am_OK_IF_NOT_THERE);
  cmd.Set(Am_OLD_VALUE, value);
}